

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter
          (Normalizer2Impl *this,UChar *start,UChar *p,UBool onlyContiguous)

{
  UChar UVar1;
  UBool UVar2;
  int iVar3;
  UCPTrie *trie;
  
  if (start != p) {
    UVar1 = p[-1];
    if ((UVar1 & 0xf800U) == 0xd800) {
      if ((p + -1 == start || ((ushort)UVar1 >> 10 & 1) == 0) || ((p[-2] & 0xfc00U) != 0xd800)) {
        trie = this->normTrie;
        iVar3 = trie->dataLength + -1;
      }
      else {
        iVar3 = (uint)(ushort)UVar1 + (uint)(ushort)p[-2] * 0x400 + -0x35fdc00;
        trie = this->normTrie;
        if (iVar3 < trie->highStart) {
          iVar3 = ucptrie_internalSmallIndex_63(trie,iVar3);
          trie = this->normTrie;
        }
        else {
          iVar3 = trie->dataLength + -2;
        }
      }
    }
    else {
      trie = this->normTrie;
      iVar3 = ((ushort)UVar1 & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
    UVar2 = norm16HasCompBoundaryAfter
                      (this,*(uint16_t *)((long)(trie->data).ptr0 + (long)iVar3 * 2),onlyContiguous)
    ;
    return UVar2;
  }
  return '\x01';
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryAfter(const UChar *start, const UChar *p,
                                            UBool onlyContiguous) const {
    if (start == p) {
        return TRUE;
    }
    UChar32 c;
    uint16_t norm16;
    UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
    return norm16HasCompBoundaryAfter(norm16, onlyContiguous);
}